

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::RegisteredHitCounters::validateNTimes
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  int iVar1;
  undefined4 extraout_var;
  _func_int **pp_Var2;
  HitCounter *local_40;
  HitCounter *counter;
  ScopedLock scopedLock;
  size_t n_local;
  LineNumber lineNumber_local;
  char *filename_local;
  RegisteredHitCounters *this_local;
  
  scopedLock._vptr_NoScopedLock = (_func_int **)n;
  lineNumber_local = (LineNumber)filename;
  filename_local = (char *)this;
  iVar1 = (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&counter,
             (NoMutex *)CONCAT44(extraout_var,iVar1));
  local_40 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
             get<char_const*,unsigned_long>
                       ((RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *)
                        this,(char **)&lineNumber_local,lineNumber);
  if (local_40 == (HitCounter *)0x0) {
    local_40 = (HitCounter *)operator_new(0x20);
    HitCounter::HitCounter(local_40,(char *)lineNumber_local,lineNumber);
    (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])();
  }
  HitCounter::increment(local_40);
  pp_Var2 = (_func_int **)HitCounter::hitCounts(local_40);
  this_local._7_1_ = pp_Var2 <= scopedLock._vptr_NoScopedLock;
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&counter);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RegisteredHitCounters::validateNTimes(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  counter->increment();
  // Do not use validateHitCounts here since we do not want to reset counter here
  if (counter->hitCounts() <= n)
    return true;
  return false;
}